

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O1

void Map_MappingSetRefs(Map_Man_t *pMan)

{
  Map_NodeVec_t *pMVar1;
  Map_Node_t **ppMVar2;
  Map_Node_t *pMVar3;
  int iVar4;
  long lVar5;
  
  if (pMan->fUseProfile != 0) {
    Mio_LibraryCleanProfile2(pMan->pSuperLib->pGenlib);
  }
  pMVar1 = pMan->vMapObjs;
  if (0 < pMVar1->nSize) {
    ppMVar2 = pMVar1->pArray;
    lVar5 = 0;
    do {
      pMVar3 = ppMVar2[lVar5];
      pMVar3->nRefAct[0] = 0;
      pMVar3->nRefAct[1] = 0;
      pMVar3->nRefAct[2] = 0;
      lVar5 = lVar5 + 1;
    } while (lVar5 < pMVar1->nSize);
  }
  if (0 < pMan->nOutputs) {
    lVar5 = 0;
    do {
      pMVar3 = pMan->pOutputs[lVar5];
      iVar4 = Map_NodeIsConst(pMVar3);
      if (iVar4 == 0) {
        Map_MappingSetRefs_rec(pMan,pMVar3);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pMan->nOutputs);
  }
  return;
}

Assistant:

void Map_MappingSetRefs( Map_Man_t * pMan )
{
    Map_Node_t * pNode;
    int i;
    if ( pMan->fUseProfile )
        Mio_LibraryCleanProfile2( pMan->pSuperLib->pGenlib );
    // clean all references
    for ( i = 0; i < pMan->vMapObjs->nSize; i++ )
    {
        pNode = pMan->vMapObjs->pArray[i];
        pNode->nRefAct[0] = 0;
        pNode->nRefAct[1] = 0;
        pNode->nRefAct[2] = 0;
    }
    // visit nodes reachable from POs in the DFS order through the best cuts
    for ( i = 0; i < pMan->nOutputs; i++ )
    {
        pNode = pMan->pOutputs[i];
        if ( !Map_NodeIsConst(pNode) )
            Map_MappingSetRefs_rec( pMan, pNode );
    }
}